

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser.c++
# Opt level: O0

Maybe<capnp::schema::Node::SourceInfo::Reader> * __thiscall
capnp::SchemaParser::getSourceInfo
          (Maybe<capnp::schema::Node::SourceInfo::Reader> *__return_storage_ptr__,SchemaParser *this
          ,Schema schema)

{
  Impl *pIVar1;
  uint64_t id;
  Reader local_50;
  SchemaParser *local_20;
  SchemaParser *this_local;
  Schema schema_local;
  
  local_20 = this;
  this_local = (SchemaParser *)schema.raw;
  schema_local.raw = (RawBrandedSchema *)__return_storage_ptr__;
  pIVar1 = kj::Own<capnp::SchemaParser::Impl,_std::nullptr_t>::operator->(&this->impl);
  Schema::getProto(&local_50,(Schema *)&this_local);
  id = capnp::schema::Node::Reader::getId(&local_50);
  capnp::compiler::Compiler::getSourceInfo(__return_storage_ptr__,&pIVar1->compiler,id);
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<schema::Node::SourceInfo::Reader> SchemaParser::getSourceInfo(Schema schema) const {
  return impl->compiler.getSourceInfo(schema.getProto().getId());
}